

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache_test.cpp
# Opt level: O0

void __thiscall BufferCache_Basics_Test::TestBody(BufferCache_Basics_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  undefined1 uVar2;
  int *expr2;
  BufferCache<int> *pBVar3;
  AssertHelper *this_00;
  AssertHelper *pAVar4;
  vector<int,_std::allocator<int>_> *this_01;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  size_t i_1;
  AssertionResult gtest_ar_5;
  int *ptr2;
  vector<int,_std::allocator<int>_> v2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  size_t i;
  int *ptr;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> v;
  AssertionResult gtest_ar_;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  AssertionResult *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  char *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  int line;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  allocator_type *in_stack_fffffffffffffcd8;
  Type type;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffce0;
  AssertHelper *this_02;
  undefined8 in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  char *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  AssertHelper *in_stack_fffffffffffffd30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd60;
  BufferCache<int> *in_stack_fffffffffffffd68;
  BufferCache<int> *this_03;
  char *in_stack_fffffffffffffd78;
  AssertionResult local_238 [2];
  AssertionResult local_218;
  AssertHelper *local_208;
  AssertionResult local_1f0;
  int *local_1e0;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  vector<int,_std::allocator<int>_> local_1b0;
  size_t local_188;
  undefined8 local_180;
  AssertionResult local_178 [2];
  AssertHelper *local_158;
  AssertionResult local_150 [2];
  size_t local_130;
  undefined8 local_128;
  AssertionResult local_120 [2];
  AssertionResult local_100;
  BufferCache<int> *local_f0;
  int *local_e8;
  size_t local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 *local_88;
  undefined8 local_80;
  vector<int,_std::allocator<int>_> local_78;
  uint local_5c;
  string local_58 [64];
  AssertionResult local_18;
  
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffcb0,(bool)in_stack_fffffffffffffcaf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffce0,
               (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd30,
               (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x596171);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x596202);
  if (local_5c == 0) {
    local_a8 = 0x200000001;
    uStack_a0 = 0x400000003;
    local_98 = 5;
    local_88 = &local_a8;
    local_80 = 5;
    std::allocator<int>::allocator((allocator<int> *)0x596261);
    __l._M_len._0_7_ = in_stack_fffffffffffffcf0;
    __l._M_array = (iterator)in_stack_fffffffffffffce8;
    __l._M_len._7_1_ = in_stack_fffffffffffffcf7;
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffce0,__l,in_stack_fffffffffffffcd8);
    std::allocator<int>::~allocator((allocator<int> *)0x596295);
    local_c4 = 0;
    local_d0 = pbrt::BufferCache<int>::BytesUsed(pbrt::intBufferCache);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (int *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (unsigned_long *)in_stack_fffffffffffffcb0,
               (type *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      in_stack_fffffffffffffd78 =
           testing::AssertionResult::failure_message((AssertionResult *)0x5963a9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffce0,
                 (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd30,
                 (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x59640c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x596464);
    expr2 = pbrt::BufferCache<int>::LookupOrAdd(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60)
    ;
    local_f0 = (BufferCache<int> *)0x0;
    local_e8 = expr2;
    while (this_03 = local_f0,
          pBVar3 = (BufferCache<int> *)std::vector<int,_std::allocator<int>_>::size(&local_78),
          this_03 < pBVar3) {
      in_stack_fffffffffffffd60 = (vector<int,_std::allocator<int>_> *)(local_e8 + (long)local_f0);
      std::vector<int,_std::allocator<int>_>::operator[](&local_78,(size_type)local_f0);
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                 (int *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 (int *)in_stack_fffffffffffffcb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffce0);
        testing::AssertionResult::failure_message((AssertionResult *)0x596592);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffce0,
                   (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd30,
                   (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
        testing::Message::~Message((Message *)0x5965f5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x59664a);
      local_f0 = (BufferCache<int> *)((long)&(local_f0->alloc).memoryResource + 1);
    }
    local_128 = 0x14;
    local_130 = pbrt::BufferCache<int>::BytesUsed(pbrt::intBufferCache);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (unsigned_long *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      testing::AssertionResult::failure_message((AssertionResult *)0x596734);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffce0,
                 (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd30,
                 (Message *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x596797);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5967ef);
    this_00 = (AssertHelper *)pbrt::BufferCache<int>::LookupOrAdd(this_03,in_stack_fffffffffffffd60)
    ;
    local_158 = this_00;
    testing::internal::EqHelper<false>::Compare<int_const*,int_const*>
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (int **)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (int **)in_stack_fffffffffffffcb0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(local_150);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      testing::AssertionResult::failure_message((AssertionResult *)0x5968bc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffce0,
                 (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x596919);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x596971);
    local_180 = 0x14;
    local_188 = pbrt::BufferCache<int>::BytesUsed(pbrt::intBufferCache);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (unsigned_long *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      testing::AssertionResult::failure_message((AssertionResult *)0x596a36);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffce0,
                 (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x596a93);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x596aeb);
    local_1d0 = 1;
    local_1cc = 2;
    local_1c8 = 3;
    local_1c4 = 4;
    local_1c0 = &local_1d0;
    local_1b8 = 4;
    std::allocator<int>::allocator((allocator<int> *)0x596b45);
    __l_00._M_len._0_7_ = in_stack_fffffffffffffcf0;
    __l_00._M_array = (iterator)in_stack_fffffffffffffce8;
    __l_00._M_len._7_1_ = in_stack_fffffffffffffcf7;
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffce0,__l_00,in_stack_fffffffffffffcd8);
    std::allocator<int>::~allocator((allocator<int> *)0x596b76);
    local_1e0 = pbrt::BufferCache<int>::LookupOrAdd(this_03,in_stack_fffffffffffffd60);
    testing::internal::CmpHelperNE<int_const*,int_const*>
              (in_stack_fffffffffffffd78,(char *)expr2,(int **)this_03,
               (int **)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      testing::AssertionResult::failure_message((AssertionResult *)0x596c76);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffce0,
                 (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x596cd3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x596d2b);
    local_208 = (AssertHelper *)0x0;
    while( true ) {
      type = (Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      this_02 = local_208;
      pAVar4 = (AssertHelper *)std::vector<int,_std::allocator<int>_>::size(&local_1b0);
      if (pAVar4 <= this_02) break;
      in_stack_fffffffffffffcd8 = (allocator_type *)(local_1e0 + (long)local_208);
      std::vector<int,_std::allocator<int>_>::operator[](&local_1b0,(size_type)local_208);
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                 (int *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 (int *)in_stack_fffffffffffffcb0);
      in_stack_fffffffffffffcd7 = testing::AssertionResult::operator_cast_to_bool(&local_218);
      if (!(bool)in_stack_fffffffffffffcd7) {
        testing::Message::Message((Message *)this_02);
        in_stack_fffffffffffffcc8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x596e16);
        testing::internal::AssertHelper::AssertHelper
                  (this_02,(Type)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),in_stack_fffffffffffffcc0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd28));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
        testing::Message::~Message((Message *)0x596e73);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x596ec8);
      local_208 = (AssertHelper *)
                  ((long)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_208->data_)->ptr_ + 1);
    }
    this_01 = (vector<int,_std::allocator<int>_> *)
              pbrt::BufferCache<int>::BytesUsed(pbrt::intBufferCache);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffcc8,(char *)this_01,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (unsigned_long *)in_stack_fffffffffffffcb0);
    line = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_238);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      pAVar4 = (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x596fa6);
      testing::internal::AssertHelper::AssertHelper
                (this_02,type,(char *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 line,(char *)this_01);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd28));
      testing::internal::AssertHelper::~AssertHelper(pAVar4);
      testing::Message::~Message((Message *)0x597003);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x597058);
    std::vector<int,_std::allocator<int>_>::~vector(this_01);
    std::vector<int,_std::allocator<int>_>::~vector(this_01);
  }
  return;
}

Assistant:

TEST(BufferCache, Basics) {
    ASSERT_FALSE(intBufferCache == nullptr);

    std::vector<int> v{1,2,3,4,5};

    EXPECT_EQ(0, intBufferCache->BytesUsed());

    const int *ptr = intBufferCache->LookupOrAdd(v);
    for (size_t i = 0; i < v.size(); ++i)
        EXPECT_EQ(ptr[i], v[i]);

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    EXPECT_EQ(ptr, intBufferCache->LookupOrAdd(v));

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    std::vector<int> v2{1,2,3,4};
    const int *ptr2 = intBufferCache->LookupOrAdd(v2);
    EXPECT_NE(ptr, ptr2);
    for (size_t i = 0; i < v2.size(); ++i)
        EXPECT_EQ(ptr2[i], v2[i]);

    EXPECT_EQ(9 * sizeof(int), intBufferCache->BytesUsed());
}